

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
          (DeepScanLineInputFile *this,Header *header,IStream *is,int version,int numThreads)

{
  ContextInitializer *this_00;
  element_type *peVar1;
  int in_ECX;
  ContextInitializer *this_01;
  bool onoff;
  IStream *in_stack_ffffffffffffff48;
  ContextInitializer *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  ContextInitializer *in_stack_ffffffffffffff60;
  char *filename;
  DeepScanLineInputFile *this_02;
  
  this_00 = (ContextInitializer *)IStream::fileName((IStream *)0x1a4dd8);
  filename = (char *)0x0;
  this_02 = (DeepScanLineInputFile *)0x0;
  this_01 = (ContextInitializer *)&stack0xffffffffffffff68;
  ContextInitializer::ContextInitializer(this_01);
  onoff = SUB81((ulong)this_01 >> 0x38,0);
  ContextInitializer::silentHeaderParse(this_00,onoff);
  ContextInitializer::strictHeaderValidation(this_00,onoff);
  ContextInitializer::setInputStream(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  DeepScanLineInputFile(this_02,filename,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  peVar1 = std::
           __shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a4e85);
  peVar1->version = in_ECX;
  std::
  __shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a4ea3);
  Header::operator=((Header *)in_stack_ffffffffffffff60,
                    (Header *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  peVar1 = std::
           __shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a4ec4);
  peVar1->header_filled = true;
  return;
}

Assistant:

DeepScanLineInputFile::DeepScanLineInputFile (
    const Header&                            header,
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream* is,
    int                                      version,
    int                                      numThreads)
    : DeepScanLineInputFile (
        is->fileName (),
        ContextInitializer ()
        .silentHeaderParse (true)
        .strictHeaderValidation (false)
        .setInputStream (is),
        numThreads)
{
    // who uses this interface, can we remove it?
    _data->version = version;
    _data->header = header;
    _data->header_filled = true;
}